

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_16,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::TriangleMiMBIntersectorKPluecker<4,_16,_true>_>,_true>
     ::intersect(vint<16> *valid_i,Intersectors *This,RayHitK<16> *ray,RayQueryContext *context)

{
  BVH *bvh;
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t k;
  ulong uVar6;
  int iVar7;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  int iVar28;
  undefined1 in_ZMM0 [64];
  Precalculations pre;
  TravRayK<16,_true> tray;
  Precalculations local_401;
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_400;
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar8 = vpternlogd_avx512f(in_ZMM0,in_ZMM0,in_ZMM0,0xff);
    uVar6 = vpcmpeqd_avx512f(auVar8,(undefined1  [64])valid_i->field_0);
    if ((short)uVar6 != 0) {
      local_400._0_8_ = *(undefined8 *)ray;
      local_400._8_8_ = *(undefined8 *)(ray + 8);
      local_400._16_8_ = *(undefined8 *)(ray + 0x10);
      local_400._24_8_ = *(undefined8 *)(ray + 0x18);
      local_400._32_8_ = *(undefined8 *)(ray + 0x20);
      local_400._40_8_ = *(undefined8 *)(ray + 0x28);
      local_400._48_8_ = *(undefined8 *)(ray + 0x30);
      local_400._56_8_ = *(undefined8 *)(ray + 0x38);
      local_400._64_8_ = *(undefined8 *)(ray + 0x40);
      local_400._72_8_ = *(undefined8 *)(ray + 0x48);
      local_400._80_8_ = *(undefined8 *)(ray + 0x50);
      local_400._88_8_ = *(undefined8 *)(ray + 0x58);
      local_400._96_8_ = *(undefined8 *)(ray + 0x60);
      local_400._104_8_ = *(undefined8 *)(ray + 0x68);
      local_400._112_8_ = *(undefined8 *)(ray + 0x70);
      local_400._120_8_ = *(undefined8 *)(ray + 0x78);
      local_400._128_8_ = *(undefined8 *)(ray + 0x80);
      local_400._136_8_ = *(undefined8 *)(ray + 0x88);
      local_400._144_8_ = *(undefined8 *)(ray + 0x90);
      local_400._152_8_ = *(undefined8 *)(ray + 0x98);
      local_400._160_8_ = *(undefined8 *)(ray + 0xa0);
      local_400._168_8_ = *(undefined8 *)(ray + 0xa8);
      local_400._176_8_ = *(undefined8 *)(ray + 0xb0);
      local_400._184_8_ = *(undefined8 *)(ray + 0xb8);
      local_340 = *(undefined1 (*) [64])(ray + 0x100);
      local_300 = *(undefined1 (*) [64])(ray + 0x140);
      local_2c0 = *(undefined1 (*) [64])(ray + 0x180);
      auVar8 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar9 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
      auVar10 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar11 = vdivps_avx512f(auVar10,local_340);
      auVar12 = vandps_avx512dq(local_340,auVar8);
      uVar3 = vcmpps_avx512f(auVar12,auVar9,1);
      auVar12 = vandps_avx512dq(local_300,auVar8);
      auVar13 = vdivps_avx512f(auVar10,local_300);
      uVar4 = vcmpps_avx512f(auVar12,auVar9,1);
      auVar8 = vandps_avx512dq(local_2c0,auVar8);
      uVar5 = vcmpps_avx512f(auVar8,auVar9,1);
      auVar8 = vdivps_avx512f(auVar10,local_2c0);
      auVar9 = vbroadcastss_avx512f(ZEXT416(0x5d5e0b6b));
      bVar1 = (bool)((byte)uVar3 & 1);
      iVar7 = auVar9._0_4_;
      local_280._0_4_ = (uint)bVar1 * iVar7 | (uint)!bVar1 * auVar11._0_4_;
      bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
      iVar14 = auVar9._4_4_;
      local_280._4_4_ = (uint)bVar1 * iVar14 | (uint)!bVar1 * auVar11._4_4_;
      bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
      iVar15 = auVar9._8_4_;
      local_280._8_4_ = (uint)bVar1 * iVar15 | (uint)!bVar1 * auVar11._8_4_;
      bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
      iVar16 = auVar9._12_4_;
      local_280._12_4_ = (uint)bVar1 * iVar16 | (uint)!bVar1 * auVar11._12_4_;
      bVar1 = (bool)((byte)(uVar3 >> 4) & 1);
      iVar17 = auVar9._16_4_;
      local_280._16_4_ = (uint)bVar1 * iVar17 | (uint)!bVar1 * auVar11._16_4_;
      bVar1 = (bool)((byte)(uVar3 >> 5) & 1);
      iVar18 = auVar9._20_4_;
      local_280._20_4_ = (uint)bVar1 * iVar18 | (uint)!bVar1 * auVar11._20_4_;
      bVar1 = (bool)((byte)(uVar3 >> 6) & 1);
      iVar19 = auVar9._24_4_;
      local_280._24_4_ = (uint)bVar1 * iVar19 | (uint)!bVar1 * auVar11._24_4_;
      bVar1 = (bool)((byte)(uVar3 >> 7) & 1);
      iVar20 = auVar9._28_4_;
      local_280._28_4_ = (uint)bVar1 * iVar20 | (uint)!bVar1 * auVar11._28_4_;
      bVar1 = (bool)((byte)(uVar3 >> 8) & 1);
      iVar21 = auVar9._32_4_;
      local_280._32_4_ = (uint)bVar1 * iVar21 | (uint)!bVar1 * auVar11._32_4_;
      bVar1 = (bool)((byte)(uVar3 >> 9) & 1);
      iVar22 = auVar9._36_4_;
      local_280._36_4_ = (uint)bVar1 * iVar22 | (uint)!bVar1 * auVar11._36_4_;
      bVar1 = (bool)((byte)(uVar3 >> 10) & 1);
      iVar23 = auVar9._40_4_;
      local_280._40_4_ = (uint)bVar1 * iVar23 | (uint)!bVar1 * auVar11._40_4_;
      bVar1 = (bool)((byte)(uVar3 >> 0xb) & 1);
      iVar24 = auVar9._44_4_;
      local_280._44_4_ = (uint)bVar1 * iVar24 | (uint)!bVar1 * auVar11._44_4_;
      bVar1 = (bool)((byte)(uVar3 >> 0xc) & 1);
      iVar25 = auVar9._48_4_;
      local_280._48_4_ = (uint)bVar1 * iVar25 | (uint)!bVar1 * auVar11._48_4_;
      bVar1 = (bool)((byte)(uVar3 >> 0xd) & 1);
      iVar26 = auVar9._52_4_;
      local_280._52_4_ = (uint)bVar1 * iVar26 | (uint)!bVar1 * auVar11._52_4_;
      bVar1 = (bool)((byte)(uVar3 >> 0xe) & 1);
      iVar27 = auVar9._56_4_;
      iVar28 = auVar9._60_4_;
      local_280._56_4_ = (uint)bVar1 * iVar27 | (uint)!bVar1 * auVar11._56_4_;
      bVar1 = SUB81(uVar3 >> 0xf,0);
      local_280._60_4_ = (uint)bVar1 * iVar28 | (uint)!bVar1 * auVar11._60_4_;
      bVar1 = (bool)((byte)uVar4 & 1);
      local_240._0_4_ = (uint)bVar1 * iVar7 | (uint)!bVar1 * auVar13._0_4_;
      bVar1 = (bool)((byte)(uVar4 >> 1) & 1);
      local_240._4_4_ = (uint)bVar1 * iVar14 | (uint)!bVar1 * auVar13._4_4_;
      bVar1 = (bool)((byte)(uVar4 >> 2) & 1);
      local_240._8_4_ = (uint)bVar1 * iVar15 | (uint)!bVar1 * auVar13._8_4_;
      bVar1 = (bool)((byte)(uVar4 >> 3) & 1);
      local_240._12_4_ = (uint)bVar1 * iVar16 | (uint)!bVar1 * auVar13._12_4_;
      bVar1 = (bool)((byte)(uVar4 >> 4) & 1);
      local_240._16_4_ = (uint)bVar1 * iVar17 | (uint)!bVar1 * auVar13._16_4_;
      bVar1 = (bool)((byte)(uVar4 >> 5) & 1);
      local_240._20_4_ = (uint)bVar1 * iVar18 | (uint)!bVar1 * auVar13._20_4_;
      bVar1 = (bool)((byte)(uVar4 >> 6) & 1);
      local_240._24_4_ = (uint)bVar1 * iVar19 | (uint)!bVar1 * auVar13._24_4_;
      bVar1 = (bool)((byte)(uVar4 >> 7) & 1);
      local_240._28_4_ = (uint)bVar1 * iVar20 | (uint)!bVar1 * auVar13._28_4_;
      bVar1 = (bool)((byte)(uVar4 >> 8) & 1);
      local_240._32_4_ = (uint)bVar1 * iVar21 | (uint)!bVar1 * auVar13._32_4_;
      bVar1 = (bool)((byte)(uVar4 >> 9) & 1);
      local_240._36_4_ = (uint)bVar1 * iVar22 | (uint)!bVar1 * auVar13._36_4_;
      bVar1 = (bool)((byte)(uVar4 >> 10) & 1);
      local_240._40_4_ = (uint)bVar1 * iVar23 | (uint)!bVar1 * auVar13._40_4_;
      bVar1 = (bool)((byte)(uVar4 >> 0xb) & 1);
      local_240._44_4_ = (uint)bVar1 * iVar24 | (uint)!bVar1 * auVar13._44_4_;
      bVar1 = (bool)((byte)(uVar4 >> 0xc) & 1);
      local_240._48_4_ = (uint)bVar1 * iVar25 | (uint)!bVar1 * auVar13._48_4_;
      bVar1 = (bool)((byte)(uVar4 >> 0xd) & 1);
      local_240._52_4_ = (uint)bVar1 * iVar26 | (uint)!bVar1 * auVar13._52_4_;
      bVar1 = (bool)((byte)(uVar4 >> 0xe) & 1);
      local_240._56_4_ = (uint)bVar1 * iVar27 | (uint)!bVar1 * auVar13._56_4_;
      bVar1 = SUB81(uVar4 >> 0xf,0);
      local_240._60_4_ = (uint)bVar1 * iVar28 | (uint)!bVar1 * auVar13._60_4_;
      bVar1 = (bool)((byte)uVar5 & 1);
      local_200._0_4_ = (uint)bVar1 * iVar7 | (uint)!bVar1 * auVar8._0_4_;
      bVar1 = (bool)((byte)(uVar5 >> 1) & 1);
      local_200._4_4_ = (uint)bVar1 * iVar14 | (uint)!bVar1 * auVar8._4_4_;
      bVar1 = (bool)((byte)(uVar5 >> 2) & 1);
      local_200._8_4_ = (uint)bVar1 * iVar15 | (uint)!bVar1 * auVar8._8_4_;
      bVar1 = (bool)((byte)(uVar5 >> 3) & 1);
      local_200._12_4_ = (uint)bVar1 * iVar16 | (uint)!bVar1 * auVar8._12_4_;
      bVar1 = (bool)((byte)(uVar5 >> 4) & 1);
      local_200._16_4_ = (uint)bVar1 * iVar17 | (uint)!bVar1 * auVar8._16_4_;
      bVar1 = (bool)((byte)(uVar5 >> 5) & 1);
      local_200._20_4_ = (uint)bVar1 * iVar18 | (uint)!bVar1 * auVar8._20_4_;
      bVar1 = (bool)((byte)(uVar5 >> 6) & 1);
      local_200._24_4_ = (uint)bVar1 * iVar19 | (uint)!bVar1 * auVar8._24_4_;
      bVar1 = (bool)((byte)(uVar5 >> 7) & 1);
      local_200._28_4_ = (uint)bVar1 * iVar20 | (uint)!bVar1 * auVar8._28_4_;
      bVar1 = (bool)((byte)(uVar5 >> 8) & 1);
      local_200._32_4_ = (uint)bVar1 * iVar21 | (uint)!bVar1 * auVar8._32_4_;
      bVar1 = (bool)((byte)(uVar5 >> 9) & 1);
      local_200._36_4_ = (uint)bVar1 * iVar22 | (uint)!bVar1 * auVar8._36_4_;
      bVar1 = (bool)((byte)(uVar5 >> 10) & 1);
      local_200._40_4_ = (uint)bVar1 * iVar23 | (uint)!bVar1 * auVar8._40_4_;
      bVar1 = (bool)((byte)(uVar5 >> 0xb) & 1);
      local_200._44_4_ = (uint)bVar1 * iVar24 | (uint)!bVar1 * auVar8._44_4_;
      bVar1 = (bool)((byte)(uVar5 >> 0xc) & 1);
      local_200._48_4_ = (uint)bVar1 * iVar25 | (uint)!bVar1 * auVar8._48_4_;
      bVar1 = (bool)((byte)(uVar5 >> 0xd) & 1);
      local_200._52_4_ = (uint)bVar1 * iVar26 | (uint)!bVar1 * auVar8._52_4_;
      bVar1 = (bool)((byte)(uVar5 >> 0xe) & 1);
      local_200._56_4_ = (uint)bVar1 * iVar27 | (uint)!bVar1 * auVar8._56_4_;
      bVar1 = SUB81(uVar5 >> 0xf,0);
      local_200._60_4_ = (uint)bVar1 * iVar28 | (uint)!bVar1 * auVar8._60_4_;
      auVar12 = ZEXT1264(ZEXT812(0));
      uVar3 = vcmpps_avx512f(local_280,auVar12,1);
      auVar8 = vpbroadcastd_avx512f(ZEXT416(0x10));
      auVar9._4_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar8._4_4_;
      auVar9._0_4_ = (uint)((byte)uVar3 & 1) * auVar8._0_4_;
      auVar9._8_4_ = (uint)((byte)(uVar3 >> 2) & 1) * auVar8._8_4_;
      auVar9._12_4_ = (uint)((byte)(uVar3 >> 3) & 1) * auVar8._12_4_;
      auVar9._16_4_ = (uint)((byte)(uVar3 >> 4) & 1) * auVar8._16_4_;
      auVar9._20_4_ = (uint)((byte)(uVar3 >> 5) & 1) * auVar8._20_4_;
      auVar9._24_4_ = (uint)((byte)(uVar3 >> 6) & 1) * auVar8._24_4_;
      auVar9._28_4_ = (uint)((byte)(uVar3 >> 7) & 1) * auVar8._28_4_;
      auVar9._32_4_ = (uint)((byte)(uVar3 >> 8) & 1) * auVar8._32_4_;
      auVar9._36_4_ = (uint)((byte)(uVar3 >> 9) & 1) * auVar8._36_4_;
      auVar9._40_4_ = (uint)((byte)(uVar3 >> 10) & 1) * auVar8._40_4_;
      auVar9._44_4_ = (uint)((byte)(uVar3 >> 0xb) & 1) * auVar8._44_4_;
      auVar9._48_4_ = (uint)((byte)(uVar3 >> 0xc) & 1) * auVar8._48_4_;
      auVar9._52_4_ = (uint)((byte)(uVar3 >> 0xd) & 1) * auVar8._52_4_;
      auVar9._56_4_ = (uint)((byte)(uVar3 >> 0xe) & 1) * auVar8._56_4_;
      auVar9._60_4_ = (uint)(byte)(uVar3 >> 0xf) * auVar8._60_4_;
      local_1c0 = vmovdqa64_avx512f(auVar9);
      uVar3 = vcmpps_avx512f(local_240,auVar12,5);
      auVar8 = vpbroadcastd_avx512f(ZEXT416(0x30));
      auVar9 = vpbroadcastd_avx512f(ZEXT416(0x20));
      bVar1 = (bool)((byte)uVar3 & 1);
      auVar10._0_4_ = (uint)bVar1 * auVar9._0_4_ | (uint)!bVar1 * auVar8._0_4_;
      bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
      auVar10._4_4_ = (uint)bVar1 * auVar9._4_4_ | (uint)!bVar1 * auVar8._4_4_;
      bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
      auVar10._8_4_ = (uint)bVar1 * auVar9._8_4_ | (uint)!bVar1 * auVar8._8_4_;
      bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
      auVar10._12_4_ = (uint)bVar1 * auVar9._12_4_ | (uint)!bVar1 * auVar8._12_4_;
      bVar1 = (bool)((byte)(uVar3 >> 4) & 1);
      auVar10._16_4_ = (uint)bVar1 * auVar9._16_4_ | (uint)!bVar1 * auVar8._16_4_;
      bVar1 = (bool)((byte)(uVar3 >> 5) & 1);
      auVar10._20_4_ = (uint)bVar1 * auVar9._20_4_ | (uint)!bVar1 * auVar8._20_4_;
      bVar1 = (bool)((byte)(uVar3 >> 6) & 1);
      auVar10._24_4_ = (uint)bVar1 * auVar9._24_4_ | (uint)!bVar1 * auVar8._24_4_;
      bVar1 = (bool)((byte)(uVar3 >> 7) & 1);
      auVar10._28_4_ = (uint)bVar1 * auVar9._28_4_ | (uint)!bVar1 * auVar8._28_4_;
      bVar1 = (bool)((byte)(uVar3 >> 8) & 1);
      auVar10._32_4_ = (uint)bVar1 * auVar9._32_4_ | (uint)!bVar1 * auVar8._32_4_;
      bVar1 = (bool)((byte)(uVar3 >> 9) & 1);
      auVar10._36_4_ = (uint)bVar1 * auVar9._36_4_ | (uint)!bVar1 * auVar8._36_4_;
      bVar1 = (bool)((byte)(uVar3 >> 10) & 1);
      auVar10._40_4_ = (uint)bVar1 * auVar9._40_4_ | (uint)!bVar1 * auVar8._40_4_;
      bVar1 = (bool)((byte)(uVar3 >> 0xb) & 1);
      auVar10._44_4_ = (uint)bVar1 * auVar9._44_4_ | (uint)!bVar1 * auVar8._44_4_;
      bVar1 = (bool)((byte)(uVar3 >> 0xc) & 1);
      auVar10._48_4_ = (uint)bVar1 * auVar9._48_4_ | (uint)!bVar1 * auVar8._48_4_;
      bVar1 = (bool)((byte)(uVar3 >> 0xd) & 1);
      auVar10._52_4_ = (uint)bVar1 * auVar9._52_4_ | (uint)!bVar1 * auVar8._52_4_;
      bVar1 = (bool)((byte)(uVar3 >> 0xe) & 1);
      auVar10._56_4_ = (uint)bVar1 * auVar9._56_4_ | (uint)!bVar1 * auVar8._56_4_;
      bVar1 = SUB81(uVar3 >> 0xf,0);
      auVar10._60_4_ = (uint)bVar1 * auVar9._60_4_ | (uint)!bVar1 * auVar8._60_4_;
      local_180 = vmovdqa64_avx512f(auVar10);
      uVar3 = vcmpps_avx512f(local_200,auVar12,5);
      auVar8 = vpbroadcastd_avx512f(ZEXT416(0x50));
      auVar9 = vpbroadcastd_avx512f(ZEXT416(0x40));
      bVar1 = (bool)((byte)uVar3 & 1);
      auVar11._0_4_ = (uint)bVar1 * auVar9._0_4_ | (uint)!bVar1 * auVar8._0_4_;
      bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
      auVar11._4_4_ = (uint)bVar1 * auVar9._4_4_ | (uint)!bVar1 * auVar8._4_4_;
      bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
      auVar11._8_4_ = (uint)bVar1 * auVar9._8_4_ | (uint)!bVar1 * auVar8._8_4_;
      bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
      auVar11._12_4_ = (uint)bVar1 * auVar9._12_4_ | (uint)!bVar1 * auVar8._12_4_;
      bVar1 = (bool)((byte)(uVar3 >> 4) & 1);
      auVar11._16_4_ = (uint)bVar1 * auVar9._16_4_ | (uint)!bVar1 * auVar8._16_4_;
      bVar1 = (bool)((byte)(uVar3 >> 5) & 1);
      auVar11._20_4_ = (uint)bVar1 * auVar9._20_4_ | (uint)!bVar1 * auVar8._20_4_;
      bVar1 = (bool)((byte)(uVar3 >> 6) & 1);
      auVar11._24_4_ = (uint)bVar1 * auVar9._24_4_ | (uint)!bVar1 * auVar8._24_4_;
      bVar1 = (bool)((byte)(uVar3 >> 7) & 1);
      auVar11._28_4_ = (uint)bVar1 * auVar9._28_4_ | (uint)!bVar1 * auVar8._28_4_;
      bVar1 = (bool)((byte)(uVar3 >> 8) & 1);
      auVar11._32_4_ = (uint)bVar1 * auVar9._32_4_ | (uint)!bVar1 * auVar8._32_4_;
      bVar1 = (bool)((byte)(uVar3 >> 9) & 1);
      auVar11._36_4_ = (uint)bVar1 * auVar9._36_4_ | (uint)!bVar1 * auVar8._36_4_;
      bVar1 = (bool)((byte)(uVar3 >> 10) & 1);
      auVar11._40_4_ = (uint)bVar1 * auVar9._40_4_ | (uint)!bVar1 * auVar8._40_4_;
      bVar1 = (bool)((byte)(uVar3 >> 0xb) & 1);
      auVar11._44_4_ = (uint)bVar1 * auVar9._44_4_ | (uint)!bVar1 * auVar8._44_4_;
      bVar1 = (bool)((byte)(uVar3 >> 0xc) & 1);
      auVar11._48_4_ = (uint)bVar1 * auVar9._48_4_ | (uint)!bVar1 * auVar8._48_4_;
      bVar1 = (bool)((byte)(uVar3 >> 0xd) & 1);
      auVar11._52_4_ = (uint)bVar1 * auVar9._52_4_ | (uint)!bVar1 * auVar8._52_4_;
      bVar1 = (bool)((byte)(uVar3 >> 0xe) & 1);
      auVar11._56_4_ = (uint)bVar1 * auVar9._56_4_ | (uint)!bVar1 * auVar8._56_4_;
      bVar1 = SUB81(uVar3 >> 0xf,0);
      auVar11._60_4_ = (uint)bVar1 * auVar9._60_4_ | (uint)!bVar1 * auVar8._60_4_;
      local_140 = vmovdqa64_avx512f(auVar11);
      auVar8 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      auVar9 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar12);
      bVar1 = (bool)((byte)uVar6 & 1);
      local_100 = (uint)bVar1 * auVar9._0_4_ | (uint)!bVar1 * auVar8._0_4_;
      bVar1 = (bool)((byte)(uVar6 >> 1) & 1);
      uStack_fc = (uint)bVar1 * auVar9._4_4_ | (uint)!bVar1 * auVar8._4_4_;
      bVar1 = (bool)((byte)(uVar6 >> 2) & 1);
      uStack_f8 = (uint)bVar1 * auVar9._8_4_ | (uint)!bVar1 * auVar8._8_4_;
      bVar1 = (bool)((byte)(uVar6 >> 3) & 1);
      uStack_f4 = (uint)bVar1 * auVar9._12_4_ | (uint)!bVar1 * auVar8._12_4_;
      bVar1 = (bool)((byte)(uVar6 >> 4) & 1);
      uStack_f0 = (uint)bVar1 * auVar9._16_4_ | (uint)!bVar1 * auVar8._16_4_;
      bVar1 = (bool)((byte)(uVar6 >> 5) & 1);
      uStack_ec = (uint)bVar1 * auVar9._20_4_ | (uint)!bVar1 * auVar8._20_4_;
      bVar1 = (bool)((byte)(uVar6 >> 6) & 1);
      uStack_e8 = (uint)bVar1 * auVar9._24_4_ | (uint)!bVar1 * auVar8._24_4_;
      bVar1 = (bool)((byte)(uVar6 >> 7) & 1);
      uStack_e4 = (uint)bVar1 * auVar9._28_4_ | (uint)!bVar1 * auVar8._28_4_;
      bVar2 = (byte)(uVar6 >> 8);
      bVar1 = (bool)(bVar2 & 1);
      uStack_e0 = (uint)bVar1 * auVar9._32_4_ | (uint)!bVar1 * auVar8._32_4_;
      bVar1 = (bool)((byte)(uVar6 >> 9) & 1);
      uStack_dc = (uint)bVar1 * auVar9._36_4_ | (uint)!bVar1 * auVar8._36_4_;
      bVar1 = (bool)((byte)(uVar6 >> 10) & 1);
      uStack_d8 = (uint)bVar1 * auVar9._40_4_ | (uint)!bVar1 * auVar8._40_4_;
      bVar1 = (bool)((byte)(uVar6 >> 0xb) & 1);
      uStack_d4 = (uint)bVar1 * auVar9._44_4_ | (uint)!bVar1 * auVar8._44_4_;
      bVar1 = (bool)((byte)(uVar6 >> 0xc) & 1);
      uStack_d0 = (uint)bVar1 * auVar9._48_4_ | (uint)!bVar1 * auVar8._48_4_;
      bVar1 = (bool)((byte)(uVar6 >> 0xd) & 1);
      uStack_cc = (uint)bVar1 * auVar9._52_4_ | (uint)!bVar1 * auVar8._52_4_;
      bVar1 = (bool)((byte)(uVar6 >> 0xe) & 1);
      uStack_c8 = (uint)bVar1 * auVar9._56_4_ | (uint)!bVar1 * auVar8._56_4_;
      bVar1 = SUB81(uVar6 >> 0xf,0);
      uStack_c4 = (uint)bVar1 * auVar9._60_4_ | (uint)!bVar1 * auVar8._60_4_;
      auVar8 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar9 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar12);
      bVar1 = (bool)((byte)uVar6 & 1);
      local_c0 = (uint)bVar1 * auVar9._0_4_ | (uint)!bVar1 * auVar8._0_4_;
      bVar1 = (bool)((byte)(uVar6 >> 1) & 1);
      uStack_bc = (uint)bVar1 * auVar9._4_4_ | (uint)!bVar1 * auVar8._4_4_;
      bVar1 = (bool)((byte)(uVar6 >> 2) & 1);
      uStack_b8 = (uint)bVar1 * auVar9._8_4_ | (uint)!bVar1 * auVar8._8_4_;
      bVar1 = (bool)((byte)(uVar6 >> 3) & 1);
      uStack_b4 = (uint)bVar1 * auVar9._12_4_ | (uint)!bVar1 * auVar8._12_4_;
      bVar1 = (bool)((byte)(uVar6 >> 4) & 1);
      uStack_b0 = (uint)bVar1 * auVar9._16_4_ | (uint)!bVar1 * auVar8._16_4_;
      bVar1 = (bool)((byte)(uVar6 >> 5) & 1);
      uStack_ac = (uint)bVar1 * auVar9._20_4_ | (uint)!bVar1 * auVar8._20_4_;
      bVar1 = (bool)((byte)(uVar6 >> 6) & 1);
      uStack_a8 = (uint)bVar1 * auVar9._24_4_ | (uint)!bVar1 * auVar8._24_4_;
      bVar1 = (bool)((byte)(uVar6 >> 7) & 1);
      uStack_a4 = (uint)bVar1 * auVar9._28_4_ | (uint)!bVar1 * auVar8._28_4_;
      bVar1 = (bool)(bVar2 & 1);
      uStack_a0 = (uint)bVar1 * auVar9._32_4_ | (uint)!bVar1 * auVar8._32_4_;
      bVar1 = (bool)((byte)(uVar6 >> 9) & 1);
      uStack_9c = (uint)bVar1 * auVar9._36_4_ | (uint)!bVar1 * auVar8._36_4_;
      bVar1 = (bool)((byte)(uVar6 >> 10) & 1);
      uStack_98 = (uint)bVar1 * auVar9._40_4_ | (uint)!bVar1 * auVar8._40_4_;
      bVar1 = (bool)((byte)(uVar6 >> 0xb) & 1);
      uStack_94 = (uint)bVar1 * auVar9._44_4_ | (uint)!bVar1 * auVar8._44_4_;
      bVar1 = (bool)((byte)(uVar6 >> 0xc) & 1);
      uStack_90 = (uint)bVar1 * auVar9._48_4_ | (uint)!bVar1 * auVar8._48_4_;
      bVar1 = (bool)((byte)(uVar6 >> 0xd) & 1);
      uStack_8c = (uint)bVar1 * auVar9._52_4_ | (uint)!bVar1 * auVar8._52_4_;
      bVar1 = (bool)((byte)(uVar6 >> 0xe) & 1);
      uStack_88 = (uint)bVar1 * auVar9._56_4_ | (uint)!bVar1 * auVar8._56_4_;
      bVar1 = SUB81(uVar6 >> 0xf,0);
      uStack_84 = (uint)bVar1 * auVar9._60_4_ | (uint)!bVar1 * auVar8._60_4_;
      do {
        k = 0;
        for (uVar3 = uVar6; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
          k = k + 1;
        }
        intersect1(This,bvh,(NodeRef)(bvh->root).ptr,k,&local_401,ray,
                   (TravRayK<16,_true> *)&local_400.field_0,context);
        uVar6 = uVar6 - 1 & uVar6;
      } while (uVar6 != 0);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }